

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O1

void __thiscall tst_GenericModel::moveColumnsTreeSameBranch(tst_GenericModel *this)

{
  long lVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  QAbstractItemModelTester *this_00;
  QModelIndex *this_01;
  QArrayDataPointer<QVariant> *pQVar6;
  long lVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QStringView QVar21;
  QStringView QVar22;
  QStringView QVar23;
  QStringView QVar24;
  QStringView QVar25;
  QStringView QVar26;
  QStringView QVar27;
  QStringView QVar28;
  QStringView QVar29;
  QStringView QVar30;
  QStringView QVar31;
  QStringView QVar32;
  QStringView QVar33;
  QStringView QVar34;
  QStringView QVar35;
  QStringView QVar36;
  QStringView QVar37;
  QStringView QVar38;
  QStringView QVar39;
  QStringView QVar40;
  QStringView QVar41;
  QStringView QVar42;
  QStringView QVar43;
  QStringView QVar44;
  QStringView QVar45;
  QStringView QVar46;
  QStringView QVar47;
  QStringView QVar48;
  QStringView QVar49;
  QStringView QVar50;
  QStringView QVar51;
  QStringView QVar52;
  QStringView QVar53;
  QStringView QVar54;
  QStringView QVar55;
  QStringView QVar56;
  QStringView QVar57;
  QStringView QVar58;
  QStringView QVar59;
  QStringView QVar60;
  QStringView QVar61;
  QStringView QVar62;
  QStringView QVar63;
  QStringView QVar64;
  QStringView QVar65;
  QStringView QVar66;
  QStringView QVar67;
  QStringView QVar68;
  QStringView QVar69;
  QStringView QVar70;
  QStringView QVar71;
  QStringView QVar72;
  QStringView QVar73;
  QStringView QVar74;
  QStringView QVar75;
  QStringView QVar76;
  QStringView QVar77;
  QStringView QVar78;
  QStringView QVar79;
  QStringView QVar80;
  QStringView QVar81;
  QStringView QVar82;
  QStringView QVar83;
  QStringView QVar84;
  QStringView QVar85;
  QStringView QVar86;
  QStringView QVar87;
  QStringView QVar88;
  QStringView QVar89;
  QStringView QVar90;
  QStringView QVar91;
  QStringView QVar92;
  QStringView QVar93;
  QStringView QVar94;
  QStringView QVar95;
  QStringView QVar96;
  QStringView QVar97;
  QStringView QVar98;
  QStringView QVar99;
  QStringView QVar100;
  QStringView QVar101;
  QStringView QVar102;
  QStringView QVar103;
  QStringView QVar104;
  QStringView QVar105;
  QStringView QVar106;
  QStringView QVar107;
  QStringView QVar108;
  QStringView QVar109;
  QStringView QVar110;
  QStringView QVar111;
  QArrayData *local_1e0;
  storage_type_conflict *local_1d8;
  QAbstractItemModel *local_1d0;
  value_type args;
  undefined1 local_1a8 [16];
  long *local_198;
  GenericModel testModel;
  QModelIndex parIndex;
  QPersistentModelIndex oneTwoIndex;
  QSignalSpy *spyArr [2];
  QPersistentModelIndex oneOneIndex;
  ModelTest probe;
  QSignalSpy rowsAboutToBeMovedSpy;
  QSignalSpy columnsMovedSpy;
  
  GenericModel::GenericModel(&testModel,(QObject *)0x0);
  this_00 = &probe.super_QAbstractItemModelTester;
  QAbstractItemModelTester::QAbstractItemModelTester
            (this_00,(QAbstractItemModel *)&testModel,QtTest,(QObject *)0x0);
  probe._0_8_ = &PTR_metaObject_001659f8;
  rowsAboutToBeMovedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeMovedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeMovedSpy._8_8_ = 0;
  rowsAboutToBeMovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  fillTable((tst_GenericModel *)this_00,(QAbstractItemModel *)&testModel,2,6,
            (QModelIndex *)&rowsAboutToBeMovedSpy,0);
  rowsAboutToBeMovedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeMovedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeMovedSpy._8_8_ = 0;
  rowsAboutToBeMovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  this_01 = &parIndex;
  GenericModel::index((int)this_01,(int)&testModel,(QModelIndex *)0x1);
  fillTable((tst_GenericModel *)this_01,(QAbstractItemModel *)&testModel,2,6,&parIndex,0);
  QSignalSpy::QSignalSpy
            (&rowsAboutToBeMovedSpy,(QObject *)&testModel,
             "2columnsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)");
  cVar2 = QTest::qVerify(rowsAboutToBeMovedSpy.sig.d.size != 0,"rowsAboutToBeMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x883);
  if (cVar2 == '\0') goto LAB_001314c2;
  QSignalSpy::QSignalSpy
            (&columnsMovedSpy,(QObject *)&testModel,
             "2columnsMoved(QModelIndex, int, int, QModelIndex, int)");
  cVar2 = QTest::qVerify(columnsMovedSpy.sig.d.size != 0,"columnsMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x885);
  if (cVar2 != '\0') {
    spyArr[0] = &rowsAboutToBeMovedSpy;
    spyArr[1] = &columnsMovedSpy;
    bVar3 = GenericModel::moveColumns
                      ((QModelIndex *)&testModel,(int)&parIndex,2,(QModelIndex *)0x1,(int)&parIndex)
    ;
    cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveColumns(parIndex, 2, 1, parIndex, -1)",
                           "",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x888);
    if (cVar2 != '\0') {
      lVar7 = 0;
      do {
        cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar7) + 0x20),0,
                                "spy->count()","0",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x88a);
        if (cVar2 == '\0') goto LAB_0013143b;
        lVar7 = lVar7 + 8;
      } while (lVar7 != 0x10);
      bVar3 = GenericModel::moveColumns
                        ((QModelIndex *)&testModel,(int)&parIndex,2,(QModelIndex *)0x1,
                         (int)&parIndex);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveColumns(parIndex, 2, 1, parIndex, 7)"
                             ,"",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x88b);
      if (cVar2 != '\0') {
        lVar7 = 0;
        do {
          cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar7) + 0x20),0,
                                  "spy->count()","0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                  ,0x88d);
          if (cVar2 == '\0') goto LAB_0013143b;
          lVar7 = lVar7 + 8;
        } while (lVar7 != 0x10);
        bVar3 = GenericModel::moveColumns
                          ((QModelIndex *)&testModel,(int)&parIndex,-1,(QModelIndex *)0x1,
                           (int)&parIndex);
        cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                               "!testModel.moveColumns(parIndex, -1, 1, parIndex, 3)","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                               ,0x88e);
        if (cVar2 != '\0') {
          lVar7 = 0;
          do {
            cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar7) + 0x20),0,
                                    "spy->count()","0",
                                    "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                    ,0x890);
            if (cVar2 == '\0') goto LAB_0013143b;
            lVar7 = lVar7 + 8;
          } while (lVar7 != 0x10);
          bVar3 = GenericModel::moveColumns
                            ((QModelIndex *)&testModel,(int)&parIndex,6,(QModelIndex *)0x1,
                             (int)&parIndex);
          cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                                 "!testModel.moveColumns(parIndex, 6, 1, parIndex, 3)","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x891);
          if (cVar2 != '\0') {
            lVar7 = 0;
            do {
              cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar7) + 0x20),0,
                                      "spy->count()","0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                      ,0x893);
              if (cVar2 == '\0') goto LAB_0013143b;
              lVar7 = lVar7 + 8;
            } while (lVar7 != 0x10);
            bVar3 = GenericModel::moveColumns
                              ((QModelIndex *)&testModel,(int)&parIndex,1,(QModelIndex *)0x2,
                               (int)&parIndex);
            cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                                   "!testModel.moveColumns(parIndex, 1, 2, parIndex, 2)","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                   ,0x894);
            if (cVar2 != '\0') {
              lVar7 = 0;
              do {
                cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar7) + 0x20),0,
                                        "spy->count()","0",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                        ,0x896);
                if (cVar2 == '\0') goto LAB_0013143b;
                lVar7 = lVar7 + 8;
              } while (lVar7 != 0x10);
              bVar3 = GenericModel::moveColumns
                                ((QModelIndex *)&testModel,(int)&parIndex,1,(QModelIndex *)0x2,
                                 (int)&parIndex);
              cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                                     "!testModel.moveColumns(parIndex, 1, 2, parIndex, 3)","",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                     ,0x897);
              if (cVar2 != '\0') {
                lVar7 = 0;
                do {
                  cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar7) + 0x20),0,
                                          "spy->count()","0",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x899);
                  if (cVar2 == '\0') goto LAB_0013143b;
                  lVar7 = lVar7 + 8;
                } while (lVar7 != 0x10);
                GenericModel::index((int)&args,(int)&testModel,(QModelIndex *)0x1);
                QPersistentModelIndex::QPersistentModelIndex(&oneTwoIndex,(QModelIndex *)&args);
                bVar4 = (bool)GenericModel::moveColumns
                                        ((QModelIndex *)&testModel,(int)&parIndex,2,
                                         (QModelIndex *)0x1,(int)&parIndex);
                cVar2 = QTest::qVerify(bVar4,"testModel.moveColumns(parIndex, 2, 1, parIndex, 4)",""
                                       ,
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                       ,0x89c);
                if (cVar2 != '\0') {
                  GenericModel::index((int)local_1a8,(int)&testModel,(QModelIndex *)0x0);
                  if (local_198 == (long *)0x0) {
                    args.d.d = (Data *)0x0;
                    args.d.ptr = (QVariant *)0x0;
                    args.d.size = 0;
                  }
                  else {
                    (**(code **)(*local_198 + 0x90))(&args,local_198,local_1a8,0);
                  }
                  QVariant::toString();
                  QVar8.m_data = local_1d8;
                  QVar8.m_size = (qsizetype)local_1d0;
                  QVar60.m_data = L"0,0";
                  QVar60.m_size = 3;
                  cVar2 = QTest::qCompare(QVar8,QVar60,
                                          "testModel.index(0, 0, parIndex).data().toString()",
                                          "QStringLiteral(\"0,0\")",
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                          ,0x89d);
                  if (local_1e0 != (QArrayData *)0x0) {
                    LOCK();
                    (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i =
                         (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                    UNLOCK();
                    if ((local_1e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                      QArrayData::deallocate(local_1e0,2,8);
                    }
                  }
                  QVariant::~QVariant((QVariant *)&args);
                  if (cVar2 != '\0') {
                    GenericModel::index((int)local_1a8,(int)&testModel,(QModelIndex *)0x0);
                    if (local_198 == (long *)0x0) {
                      args.d.d = (Data *)0x0;
                      args.d.ptr = (QVariant *)0x0;
                      args.d.size = 0;
                    }
                    else {
                      (**(code **)(*local_198 + 0x90))(&args,local_198,local_1a8,0);
                    }
                    QVariant::toString();
                    QVar9.m_data = local_1d8;
                    QVar9.m_size = (qsizetype)local_1d0;
                    QVar61.m_data = L"0,1";
                    QVar61.m_size = 3;
                    cVar2 = QTest::qCompare(QVar9,QVar61,
                                            "testModel.index(0, 1, parIndex).data().toString()",
                                            "QStringLiteral(\"0,1\")",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                            ,0x89e);
                    if (local_1e0 != (QArrayData *)0x0) {
                      LOCK();
                      (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i =
                           (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if ((local_1e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                        QArrayData::deallocate(local_1e0,2,8);
                      }
                    }
                    QVariant::~QVariant((QVariant *)&args);
                    if (cVar2 != '\0') {
                      GenericModel::index((int)local_1a8,(int)&testModel,(QModelIndex *)0x0);
                      if (local_198 == (long *)0x0) {
                        args.d.d = (Data *)0x0;
                        args.d.ptr = (QVariant *)0x0;
                        args.d.size = 0;
                      }
                      else {
                        (**(code **)(*local_198 + 0x90))(&args,local_198,local_1a8,0);
                      }
                      QVariant::toString();
                      QVar10.m_data = local_1d8;
                      QVar10.m_size = (qsizetype)local_1d0;
                      QVar62.m_data = L"0,3";
                      QVar62.m_size = 3;
                      cVar2 = QTest::qCompare(QVar10,QVar62,
                                              "testModel.index(0, 2, parIndex).data().toString()",
                                              "QStringLiteral(\"0,3\")",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                              ,0x89f);
                      if (local_1e0 != (QArrayData *)0x0) {
                        LOCK();
                        (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i =
                             (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if ((local_1e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(local_1e0,2,8);
                        }
                      }
                      QVariant::~QVariant((QVariant *)&args);
                      if (cVar2 != '\0') {
                        GenericModel::index((int)local_1a8,(int)&testModel,(QModelIndex *)0x0);
                        if (local_198 == (long *)0x0) {
                          args.d.d = (Data *)0x0;
                          args.d.ptr = (QVariant *)0x0;
                          args.d.size = 0;
                        }
                        else {
                          (**(code **)(*local_198 + 0x90))(&args,local_198,local_1a8,0);
                        }
                        QVariant::toString();
                        QVar11.m_data = local_1d8;
                        QVar11.m_size = (qsizetype)local_1d0;
                        QVar63.m_data = L"0,2";
                        QVar63.m_size = 3;
                        cVar2 = QTest::qCompare(QVar11,QVar63,
                                                "testModel.index(0, 3, parIndex).data().toString()",
                                                "QStringLiteral(\"0,2\")",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                ,0x8a0);
                        if (local_1e0 != (QArrayData *)0x0) {
                          LOCK();
                          (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i =
                               (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if ((local_1e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate(local_1e0,2,8);
                          }
                        }
                        QVariant::~QVariant((QVariant *)&args);
                        if (cVar2 != '\0') {
                          GenericModel::index((int)local_1a8,(int)&testModel,(QModelIndex *)0x0);
                          if (local_198 == (long *)0x0) {
                            args.d.d = (Data *)0x0;
                            args.d.ptr = (QVariant *)0x0;
                            args.d.size = 0;
                          }
                          else {
                            (**(code **)(*local_198 + 0x90))(&args,local_198,local_1a8,0);
                          }
                          QVariant::toString();
                          QVar12.m_data = local_1d8;
                          QVar12.m_size = (qsizetype)local_1d0;
                          QVar64.m_data = L"0,4";
                          QVar64.m_size = 3;
                          cVar2 = QTest::qCompare(QVar12,QVar64,
                                                  "testModel.index(0, 4, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8a1);
                          if (local_1e0 != (QArrayData *)0x0) {
                            LOCK();
                            (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i =
                                 (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                            UNLOCK();
                            if ((local_1e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                              QArrayData::deallocate(local_1e0,2,8);
                            }
                          }
                          QVariant::~QVariant((QVariant *)&args);
                          if (cVar2 != '\0') {
                            GenericModel::index((int)local_1a8,(int)&testModel,(QModelIndex *)0x0);
                            if (local_198 == (long *)0x0) {
                              args.d.d = (Data *)0x0;
                              args.d.ptr = (QVariant *)0x0;
                              args.d.size = 0;
                            }
                            else {
                              (**(code **)(*local_198 + 0x90))(&args,local_198,local_1a8,0);
                            }
                            QVariant::toString();
                            QVar13.m_data = local_1d8;
                            QVar13.m_size = (qsizetype)local_1d0;
                            QVar65.m_data = L"0,5";
                            QVar65.m_size = 3;
                            cVar2 = QTest::qCompare(QVar13,QVar65,
                                                                                                        
                                                  "testModel.index(0, 5, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8a2);
                            if (local_1e0 != (QArrayData *)0x0) {
                              LOCK();
                              (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i =
                                   (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                              UNLOCK();
                              if ((local_1e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                                QArrayData::deallocate(local_1e0,2,8);
                              }
                            }
                            QVariant::~QVariant((QVariant *)&args);
                            if (cVar2 != '\0') {
                              GenericModel::index((int)local_1a8,(int)&testModel,(QModelIndex *)0x1)
                              ;
                              if (local_198 == (long *)0x0) {
                                args.d.d = (Data *)0x0;
                                args.d.ptr = (QVariant *)0x0;
                                args.d.size = 0;
                              }
                              else {
                                (**(code **)(*local_198 + 0x90))(&args,local_198,local_1a8,0);
                              }
                              QVariant::toString();
                              QVar14.m_data = local_1d8;
                              QVar14.m_size = (qsizetype)local_1d0;
                              QVar66.m_data = L"1,0";
                              QVar66.m_size = 3;
                              cVar2 = QTest::qCompare(QVar14,QVar66,
                                                                                                            
                                                  "testModel.index(1, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8a3);
                              if (local_1e0 != (QArrayData *)0x0) {
                                LOCK();
                                (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i =
                                     (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
                                UNLOCK();
                                if ((local_1e0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                                  QArrayData::deallocate(local_1e0,2,8);
                                }
                              }
                              QVariant::~QVariant((QVariant *)&args);
                              if (cVar2 != '\0') {
                                GenericModel::index((int)local_1a8,(int)&testModel,
                                                    (QModelIndex *)0x1);
                                if (local_198 == (long *)0x0) {
                                  args.d.d = (Data *)0x0;
                                  args.d.ptr = (QVariant *)0x0;
                                  args.d.size = 0;
                                }
                                else {
                                  (**(code **)(*local_198 + 0x90))(&args,local_198,local_1a8,0);
                                }
                                QVariant::toString();
                                QVar15.m_data = local_1d8;
                                QVar15.m_size = (qsizetype)local_1d0;
                                QVar67.m_data = L"1,1";
                                QVar67.m_size = 3;
                                cVar2 = QTest::qCompare(QVar15,QVar67,
                                                                                                                
                                                  "testModel.index(1, 1, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8a4);
                                if (local_1e0 != (QArrayData *)0x0) {
                                  LOCK();
                                  (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i =
                                       (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i + -1
                                  ;
                                  UNLOCK();
                                  if ((local_1e0->ref_)._q_value.super___atomic_base<int>._M_i == 0)
                                  {
                                    QArrayData::deallocate(local_1e0,2,8);
                                  }
                                }
                                QVariant::~QVariant((QVariant *)&args);
                                if (cVar2 != '\0') {
                                  GenericModel::index((int)local_1a8,(int)&testModel,
                                                      (QModelIndex *)0x1);
                                  if (local_198 == (long *)0x0) {
                                    args.d.d = (Data *)0x0;
                                    args.d.ptr = (QVariant *)0x0;
                                    args.d.size = 0;
                                  }
                                  else {
                                    (**(code **)(*local_198 + 0x90))(&args,local_198,local_1a8,0);
                                  }
                                  QVariant::toString();
                                  QVar16.m_data = local_1d8;
                                  QVar16.m_size = (qsizetype)local_1d0;
                                  QVar68.m_data = L"1,3";
                                  QVar68.m_size = 3;
                                  cVar2 = QTest::qCompare(QVar16,QVar68,
                                                                                                                    
                                                  "testModel.index(1, 2, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8a5);
                                  if (local_1e0 != (QArrayData *)0x0) {
                                    LOCK();
                                    (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i =
                                         (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i +
                                         -1;
                                    UNLOCK();
                                    if ((local_1e0->ref_)._q_value.super___atomic_base<int>._M_i ==
                                        0) {
                                      QArrayData::deallocate(local_1e0,2,8);
                                    }
                                  }
                                  QVariant::~QVariant((QVariant *)&args);
                                  if (cVar2 != '\0') {
                                    GenericModel::index((int)local_1a8,(int)&testModel,
                                                        (QModelIndex *)0x1);
                                    if (local_198 == (long *)0x0) {
                                      args.d.d = (Data *)0x0;
                                      args.d.ptr = (QVariant *)0x0;
                                      args.d.size = 0;
                                    }
                                    else {
                                      (**(code **)(*local_198 + 0x90))(&args,local_198,local_1a8,0);
                                    }
                                    QVariant::toString();
                                    QVar17.m_data = local_1d8;
                                    QVar17.m_size = (qsizetype)local_1d0;
                                    QVar69.m_data = L"1,2";
                                    QVar69.m_size = 3;
                                    cVar2 = QTest::qCompare(QVar17,QVar69,
                                                                                                                        
                                                  "testModel.index(1, 3, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8a6);
                                    if (local_1e0 != (QArrayData *)0x0) {
                                      LOCK();
                                      (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i =
                                           (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i
                                           + -1;
                                      UNLOCK();
                                      if ((local_1e0->ref_)._q_value.super___atomic_base<int>._M_i
                                          == 0) {
                                        QArrayData::deallocate(local_1e0,2,8);
                                      }
                                    }
                                    QVariant::~QVariant((QVariant *)&args);
                                    if (cVar2 != '\0') {
                                      GenericModel::index((int)local_1a8,(int)&testModel,
                                                          (QModelIndex *)0x1);
                                      if (local_198 == (long *)0x0) {
                                        args.d.d = (Data *)0x0;
                                        args.d.ptr = (QVariant *)0x0;
                                        args.d.size = 0;
                                      }
                                      else {
                                        (**(code **)(*local_198 + 0x90))
                                                  (&args,local_198,local_1a8,0);
                                      }
                                      QVariant::toString();
                                      QVar18.m_data = local_1d8;
                                      QVar18.m_size = (qsizetype)local_1d0;
                                      QVar70.m_data = L"1,4";
                                      QVar70.m_size = 3;
                                      cVar2 = QTest::qCompare(QVar18,QVar70,
                                                                                                                            
                                                  "testModel.index(1, 4, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8a7);
                                      if (local_1e0 != (QArrayData *)0x0) {
                                        LOCK();
                                        (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i =
                                             (local_1e0->ref_)._q_value.super___atomic_base<int>.
                                             _M_i + -1;
                                        UNLOCK();
                                        if ((local_1e0->ref_)._q_value.super___atomic_base<int>._M_i
                                            == 0) {
                                          QArrayData::deallocate(local_1e0,2,8);
                                        }
                                      }
                                      QVariant::~QVariant((QVariant *)&args);
                                      if (cVar2 != '\0') {
                                        GenericModel::index((int)local_1a8,(int)&testModel,
                                                            (QModelIndex *)0x1);
                                        if (local_198 == (long *)0x0) {
                                          args.d.d = (Data *)0x0;
                                          args.d.ptr = (QVariant *)0x0;
                                          args.d.size = 0;
                                        }
                                        else {
                                          (**(code **)(*local_198 + 0x90))
                                                    (&args,local_198,local_1a8,0);
                                        }
                                        QVariant::toString();
                                        QVar19.m_data = local_1d8;
                                        QVar19.m_size = (qsizetype)local_1d0;
                                        QVar71.m_data = L"1,5";
                                        QVar71.m_size = 3;
                                        cVar2 = QTest::qCompare(QVar19,QVar71,
                                                                                                                                
                                                  "testModel.index(1, 5, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8a8);
                                        if (local_1e0 != (QArrayData *)0x0) {
                                          LOCK();
                                          (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i =
                                               (local_1e0->ref_)._q_value.super___atomic_base<int>.
                                               _M_i + -1;
                                          UNLOCK();
                                          if ((local_1e0->ref_)._q_value.super___atomic_base<int>.
                                              _M_i == 0) {
                                            QArrayData::deallocate(local_1e0,2,8);
                                          }
                                        }
                                        QVariant::~QVariant((QVariant *)&args);
                                        if (cVar2 != '\0') {
                                          QPersistentModelIndex::data((int)&args);
                                          QVariant::toString();
                                          QVar20.m_data = local_1d8;
                                          QVar20.m_size = (qsizetype)local_1d0;
                                          QVar72.m_data = L"1,2";
                                          QVar72.m_size = 3;
                                          cVar2 = QTest::qCompare(QVar20,QVar72,
                                                                  "oneTwoIndex.data().toString()",
                                                                  "QStringLiteral(\"1,2\")",
                                                                                                                                    
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8a9);
                                          if (local_1e0 != (QArrayData *)0x0) {
                                            LOCK();
                                            (local_1e0->ref_)._q_value.super___atomic_base<int>._M_i
                                                 = (local_1e0->ref_)._q_value.
                                                   super___atomic_base<int>._M_i + -1;
                                            UNLOCK();
                                            if ((local_1e0->ref_)._q_value.super___atomic_base<int>.
                                                _M_i == 0) {
                                              QArrayData::deallocate(local_1e0,2,8);
                                            }
                                          }
                                          QVariant::~QVariant((QVariant *)&args);
                                          if (cVar2 != '\0') {
                                            iVar5 = QPersistentModelIndex::column();
                                            cVar2 = QTest::qCompare(iVar5,3,"oneTwoIndex.column()",
                                                                    "3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8aa);
                                            if (cVar2 != '\0') {
                                              lVar7 = 0;
                                              do {
                                                lVar1 = *(long *)((long)spyArr + lVar7);
                                                cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),
                                                                        1,"spy->count()","1",
                                                                                                                                                
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8ac);
                                                if (cVar2 == '\0') goto LAB_0013142e;
                                                QList<QList<QVariant>_>::takeFirst
                                                          (&args,(QList<QList<QVariant>_> *)
                                                                 (lVar1 + 0x10));
                                                QVariant::value<QModelIndex>
                                                          ((QModelIndex *)&local_1e0,args.d.ptr);
                                                bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                  ((QModelIndex *)&local_1e0,
                                                                   &parIndex,
                                                                   "args.at(0).value<QModelIndex>()"
                                                                   ,"parIndex",
                                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8ae);
                                                if (!bVar4) goto LAB_00131424;
                                                iVar5 = QVariant::toInt((bool *)(args.d.ptr + 1));
                                                cVar2 = QTest::qCompare(iVar5,2,"args.at(1).toInt()"
                                                                        ,"2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8af);
                                                if (cVar2 == '\0') goto LAB_00131424;
                                                iVar5 = QVariant::toInt((bool *)(args.d.ptr + 2));
                                                cVar2 = QTest::qCompare(iVar5,2,"args.at(2).toInt()"
                                                                        ,"2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8b0);
                                                if (cVar2 == '\0') goto LAB_00131424;
                                                QVariant::value<QModelIndex>
                                                          ((QModelIndex *)&local_1e0,args.d.ptr + 3)
                                                ;
                                                bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                  ((QModelIndex *)&local_1e0,
                                                                   &parIndex,
                                                                   "args.at(3).value<QModelIndex>()"
                                                                   ,"parIndex",
                                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8b1);
                                                if (!bVar4) goto LAB_00131424;
                                                iVar5 = QVariant::toInt((bool *)(args.d.ptr + 4));
                                                cVar2 = QTest::qCompare(iVar5,4,"args.at(4).toInt()"
                                                                        ,"4",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8b2);
                                                pQVar6 = &args.d;
                                                QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                          (pQVar6);
                                                if (cVar2 == '\0') goto LAB_0013142e;
                                                lVar7 = lVar7 + 8;
                                              } while (lVar7 != 0x10);
                                              fillTable((tst_GenericModel *)pQVar6,
                                                        (QAbstractItemModel *)&testModel,2,6,
                                                        &parIndex,0);
                                              GenericModel::index((int)&args,(int)&testModel,
                                                                  (QModelIndex *)0x1);
                                              QPersistentModelIndex::operator=
                                                        (&oneTwoIndex,(QModelIndex *)&args);
                                              bVar4 = (bool)GenericModel::moveColumns
                                                                      ((QModelIndex *)&testModel,
                                                                       (int)&parIndex,2,
                                                                       (QModelIndex *)0x1,
                                                                       (int)&parIndex);
                                              cVar2 = QTest::qVerify(bVar4,
                                                  "testModel.moveColumns(parIndex, 2, 1, parIndex, 0)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8b7);
                                              if (cVar2 != '\0') {
                                                GenericModel::index((int)local_1a8,(int)&testModel,
                                                                    (QModelIndex *)0x0);
                                                if (local_198 == (long *)0x0) {
                                                  args.d.d = (Data *)0x0;
                                                  args.d.ptr = (QVariant *)0x0;
                                                  args.d.size = 0;
                                                }
                                                else {
                                                  (**(code **)(*local_198 + 0x90))
                                                            (&args,local_198,local_1a8,0);
                                                }
                                                QVariant::toString();
                                                QVar21.m_data = local_1d8;
                                                QVar21.m_size = (qsizetype)local_1d0;
                                                QVar73.m_data = L"0,2";
                                                QVar73.m_size = 3;
                                                cVar2 = QTest::qCompare(QVar21,QVar73,
                                                                                                                                                
                                                  "testModel.index(0, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8b8);
                                                if (local_1e0 != (QArrayData *)0x0) {
                                                  LOCK();
                                                  (local_1e0->ref_)._q_value.
                                                  super___atomic_base<int>._M_i =
                                                       (local_1e0->ref_)._q_value.
                                                       super___atomic_base<int>._M_i + -1;
                                                  UNLOCK();
                                                  if ((local_1e0->ref_)._q_value.
                                                      super___atomic_base<int>._M_i == 0) {
                                                    QArrayData::deallocate(local_1e0,2,8);
                                                  }
                                                }
                                                QVariant::~QVariant((QVariant *)&args);
                                                if (cVar2 != '\0') {
                                                  GenericModel::index((int)local_1a8,(int)&testModel
                                                                      ,(QModelIndex *)0x0);
                                                  if (local_198 == (long *)0x0) {
                                                    args.d.d = (Data *)0x0;
                                                    args.d.ptr = (QVariant *)0x0;
                                                    args.d.size = 0;
                                                  }
                                                  else {
                                                    (**(code **)(*local_198 + 0x90))
                                                              (&args,local_198,local_1a8,0);
                                                  }
                                                  QVariant::toString();
                                                  QVar22.m_data = local_1d8;
                                                  QVar22.m_size = (qsizetype)local_1d0;
                                                  QVar74.m_data = L"0,0";
                                                  QVar74.m_size = 3;
                                                  cVar2 = QTest::qCompare(QVar22,QVar74,
                                                                                                                                                    
                                                  "testModel.index(0, 1, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8b9);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x0);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar23.m_data = local_1d8;
                                                    QVar23.m_size = (qsizetype)local_1d0;
                                                    QVar75.m_data = L"0,1";
                                                    QVar75.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar23,QVar75,
                                                                                                                                                        
                                                  "testModel.index(0, 2, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8ba);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x0);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar24.m_data = local_1d8;
                                                    QVar24.m_size = (qsizetype)local_1d0;
                                                    QVar76.m_data = L"0,3";
                                                    QVar76.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar24,QVar76,
                                                                                                                                                        
                                                  "testModel.index(0, 3, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8bb);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x0);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar25.m_data = local_1d8;
                                                    QVar25.m_size = (qsizetype)local_1d0;
                                                    QVar77.m_data = L"0,4";
                                                    QVar77.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar25,QVar77,
                                                                                                                                                        
                                                  "testModel.index(0, 4, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8bc);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x0);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar26.m_data = local_1d8;
                                                    QVar26.m_size = (qsizetype)local_1d0;
                                                    QVar78.m_data = L"0,5";
                                                    QVar78.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar26,QVar78,
                                                                                                                                                        
                                                  "testModel.index(0, 5, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8bd);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x1);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar27.m_data = local_1d8;
                                                    QVar27.m_size = (qsizetype)local_1d0;
                                                    QVar79.m_data = L"1,2";
                                                    QVar79.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar27,QVar79,
                                                                                                                                                        
                                                  "testModel.index(1, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8be);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x1);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar28.m_data = local_1d8;
                                                    QVar28.m_size = (qsizetype)local_1d0;
                                                    QVar80.m_data = L"1,0";
                                                    QVar80.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar28,QVar80,
                                                                                                                                                        
                                                  "testModel.index(1, 1, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8bf);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x1);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar29.m_data = local_1d8;
                                                    QVar29.m_size = (qsizetype)local_1d0;
                                                    QVar81.m_data = L"1,1";
                                                    QVar81.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar29,QVar81,
                                                                                                                                                        
                                                  "testModel.index(1, 2, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c0);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x1);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar30.m_data = local_1d8;
                                                    QVar30.m_size = (qsizetype)local_1d0;
                                                    QVar82.m_data = L"1,3";
                                                    QVar82.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar30,QVar82,
                                                                                                                                                        
                                                  "testModel.index(1, 3, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c1);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x1);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar31.m_data = local_1d8;
                                                    QVar31.m_size = (qsizetype)local_1d0;
                                                    QVar83.m_data = L"1,4";
                                                    QVar83.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar31,QVar83,
                                                                                                                                                        
                                                  "testModel.index(1, 4, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c2);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x1);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar32.m_data = local_1d8;
                                                    QVar32.m_size = (qsizetype)local_1d0;
                                                    QVar84.m_data = L"1,5";
                                                    QVar84.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar32,QVar84,
                                                                                                                                                        
                                                  "testModel.index(1, 5, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c3);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    QPersistentModelIndex::data((int)&args);
                                                    QVariant::toString();
                                                    QVar33.m_data = local_1d8;
                                                    QVar33.m_size = (qsizetype)local_1d0;
                                                    QVar85.m_data = L"1,2";
                                                    QVar85.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar33,QVar85,
                                                                                                                                                        
                                                  "oneTwoIndex.data().toString()",
                                                  "QStringLiteral(\"1,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c4);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    iVar5 = QPersistentModelIndex::column();
                                                    cVar2 = QTest::qCompare(iVar5,0,
                                                  "oneTwoIndex.column()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c5);
                                                  if (cVar2 != '\0') {
                                                    lVar7 = 0;
                                                    do {
                                                      lVar1 = *(long *)((long)spyArr + lVar7);
                                                      cVar2 = QTest::qCompare(*(longlong *)
                                                                               (lVar1 + 0x20),1,
                                                                              "spy->count()","1",
                                                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c7);
                                                  if (cVar2 == '\0') goto LAB_0013142e;
                                                  QList<QList<QVariant>_>::takeFirst
                                                            (&args,(QList<QList<QVariant>_> *)
                                                                   (lVar1 + 0x10));
                                                  QVariant::value<QModelIndex>
                                                            ((QModelIndex *)&local_1e0,args.d.ptr);
                                                  bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    ((QModelIndex *)&local_1e0,
                                                                     &parIndex,
                                                                                                                                          
                                                  "args.at(0).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8c9);
                                                  if (!bVar4) goto LAB_00131424;
                                                  iVar5 = QVariant::toInt((bool *)(args.d.ptr + 1));
                                                  cVar2 = QTest::qCompare(iVar5,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8ca);
                                                  if (cVar2 == '\0') goto LAB_00131424;
                                                  iVar5 = QVariant::toInt((bool *)(args.d.ptr + 2));
                                                  cVar2 = QTest::qCompare(iVar5,2,
                                                  "args.at(2).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8cb);
                                                  if (cVar2 == '\0') goto LAB_00131424;
                                                  QVariant::value<QModelIndex>
                                                            ((QModelIndex *)&local_1e0,
                                                             args.d.ptr + 3);
                                                  bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    ((QModelIndex *)&local_1e0,
                                                                     &parIndex,
                                                                                                                                          
                                                  "args.at(3).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8cc);
                                                  if (!bVar4) goto LAB_00131424;
                                                  iVar5 = QVariant::toInt((bool *)(args.d.ptr + 4));
                                                  cVar2 = QTest::qCompare(iVar5,0,
                                                  "args.at(4).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8cd);
                                                  pQVar6 = &args.d;
                                                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                            (pQVar6);
                                                  if (cVar2 == '\0') goto LAB_0013142e;
                                                  lVar7 = lVar7 + 8;
                                                  } while (lVar7 != 0x10);
                                                  fillTable((tst_GenericModel *)pQVar6,
                                                            (QAbstractItemModel *)&testModel,2,6,
                                                            &parIndex,0);
                                                  GenericModel::index((int)&args,(int)&testModel,
                                                                      (QModelIndex *)0x1);
                                                  QPersistentModelIndex::operator=
                                                            (&oneTwoIndex,(QModelIndex *)&args);
                                                  bVar4 = (bool)GenericModel::moveColumns
                                                                          ((QModelIndex *)&testModel
                                                                           ,(int)&parIndex,2,
                                                                           (QModelIndex *)0x1,
                                                                           (int)&parIndex);
                                                  cVar2 = QTest::qVerify(bVar4,
                                                  "testModel.moveColumns(parIndex, 2, 1, parIndex, 6)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8d2);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x0);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar34.m_data = local_1d8;
                                                    QVar34.m_size = (qsizetype)local_1d0;
                                                    QVar86.m_data = L"0,0";
                                                    QVar86.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar34,QVar86,
                                                                                                                                                        
                                                  "testModel.index(0, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8d3);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x0);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar35.m_data = local_1d8;
                                                    QVar35.m_size = (qsizetype)local_1d0;
                                                    QVar87.m_data = L"0,1";
                                                    QVar87.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar35,QVar87,
                                                                                                                                                        
                                                  "testModel.index(0, 1, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8d4);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x0);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar36.m_data = local_1d8;
                                                    QVar36.m_size = (qsizetype)local_1d0;
                                                    QVar88.m_data = L"0,3";
                                                    QVar88.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar36,QVar88,
                                                                                                                                                        
                                                  "testModel.index(0, 2, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8d5);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x0);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar37.m_data = local_1d8;
                                                    QVar37.m_size = (qsizetype)local_1d0;
                                                    QVar89.m_data = L"0,4";
                                                    QVar89.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar37,QVar89,
                                                                                                                                                        
                                                  "testModel.index(0, 3, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8d6);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x0);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar38.m_data = local_1d8;
                                                    QVar38.m_size = (qsizetype)local_1d0;
                                                    QVar90.m_data = L"0,5";
                                                    QVar90.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar38,QVar90,
                                                                                                                                                        
                                                  "testModel.index(0, 4, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8d7);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x0);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar39.m_data = local_1d8;
                                                    QVar39.m_size = (qsizetype)local_1d0;
                                                    QVar91.m_data = L"0,2";
                                                    QVar91.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar39,QVar91,
                                                                                                                                                        
                                                  "testModel.index(0, 5, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8d8);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x1);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar40.m_data = local_1d8;
                                                    QVar40.m_size = (qsizetype)local_1d0;
                                                    QVar92.m_data = L"1,0";
                                                    QVar92.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar40,QVar92,
                                                                                                                                                        
                                                  "testModel.index(1, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8d9);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x1);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar41.m_data = local_1d8;
                                                    QVar41.m_size = (qsizetype)local_1d0;
                                                    QVar93.m_data = L"1,1";
                                                    QVar93.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar41,QVar93,
                                                                                                                                                        
                                                  "testModel.index(1, 1, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8da);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x1);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar42.m_data = local_1d8;
                                                    QVar42.m_size = (qsizetype)local_1d0;
                                                    QVar94.m_data = L"1,3";
                                                    QVar94.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar42,QVar94,
                                                                                                                                                        
                                                  "testModel.index(1, 2, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8db);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x1);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar43.m_data = local_1d8;
                                                    QVar43.m_size = (qsizetype)local_1d0;
                                                    QVar95.m_data = L"1,4";
                                                    QVar95.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar43,QVar95,
                                                                                                                                                        
                                                  "testModel.index(1, 3, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8dc);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x1);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar44.m_data = local_1d8;
                                                    QVar44.m_size = (qsizetype)local_1d0;
                                                    QVar96.m_data = L"1,5";
                                                    QVar96.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar44,QVar96,
                                                                                                                                                        
                                                  "testModel.index(1, 4, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8dd);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x1);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar45.m_data = local_1d8;
                                                    QVar45.m_size = (qsizetype)local_1d0;
                                                    QVar97.m_data = L"1,2";
                                                    QVar97.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar45,QVar97,
                                                                                                                                                        
                                                  "testModel.index(1, 5, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8de);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    QPersistentModelIndex::data((int)&args);
                                                    QVariant::toString();
                                                    QVar46.m_data = local_1d8;
                                                    QVar46.m_size = (qsizetype)local_1d0;
                                                    QVar98.m_data = L"1,2";
                                                    QVar98.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar46,QVar98,
                                                                                                                                                        
                                                  "oneTwoIndex.data().toString()",
                                                  "QStringLiteral(\"1,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8df);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    iVar5 = QPersistentModelIndex::column();
                                                    cVar2 = QTest::qCompare(iVar5,5,
                                                  "oneTwoIndex.column()","5",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8e0);
                                                  if (cVar2 != '\0') {
                                                    lVar7 = 0;
                                                    do {
                                                      lVar1 = *(long *)((long)spyArr + lVar7);
                                                      cVar2 = QTest::qCompare(*(longlong *)
                                                                               (lVar1 + 0x20),1,
                                                                              "spy->count()","1",
                                                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8e2);
                                                  if (cVar2 == '\0') goto LAB_0013142e;
                                                  QList<QList<QVariant>_>::takeFirst
                                                            (&args,(QList<QList<QVariant>_> *)
                                                                   (lVar1 + 0x10));
                                                  QVariant::value<QModelIndex>
                                                            ((QModelIndex *)&local_1e0,args.d.ptr);
                                                  bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    ((QModelIndex *)&local_1e0,
                                                                     &parIndex,
                                                                                                                                          
                                                  "args.at(0).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8e4);
                                                  if (!bVar4) goto LAB_00131424;
                                                  iVar5 = QVariant::toInt((bool *)(args.d.ptr + 1));
                                                  cVar2 = QTest::qCompare(iVar5,2,
                                                  "args.at(1).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8e5);
                                                  if (cVar2 == '\0') goto LAB_00131424;
                                                  iVar5 = QVariant::toInt((bool *)(args.d.ptr + 2));
                                                  cVar2 = QTest::qCompare(iVar5,2,
                                                  "args.at(2).toInt()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8e6);
                                                  if (cVar2 == '\0') goto LAB_00131424;
                                                  QVariant::value<QModelIndex>
                                                            ((QModelIndex *)&local_1e0,
                                                             args.d.ptr + 3);
                                                  bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    ((QModelIndex *)&local_1e0,
                                                                     &parIndex,
                                                                                                                                          
                                                  "args.at(3).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8e7);
                                                  if (!bVar4) goto LAB_00131424;
                                                  iVar5 = QVariant::toInt((bool *)(args.d.ptr + 4));
                                                  cVar2 = QTest::qCompare(iVar5,6,
                                                  "args.at(4).toInt()","6",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8e8);
                                                  pQVar6 = &args.d;
                                                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                            (pQVar6);
                                                  if (cVar2 == '\0') goto LAB_0013142e;
                                                  lVar7 = lVar7 + 8;
                                                  } while (lVar7 != 0x10);
                                                  fillTable((tst_GenericModel *)pQVar6,
                                                            (QAbstractItemModel *)&testModel,2,6,
                                                            &parIndex,0);
                                                  GenericModel::index((int)&args,(int)&testModel,
                                                                      (QModelIndex *)0x1);
                                                  QPersistentModelIndex::QPersistentModelIndex
                                                            (&oneOneIndex,(QModelIndex *)&args);
                                                  bVar4 = (bool)GenericModel::moveColumns
                                                                          ((QModelIndex *)&testModel
                                                                           ,(int)&parIndex,0,
                                                                           (QModelIndex *)0x2,
                                                                           (int)&parIndex);
                                                  cVar2 = QTest::qVerify(bVar4,
                                                  "testModel.moveColumns(parIndex, 0, 2, parIndex, 3)"
                                                  ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8ed);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x0);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar47.m_data = local_1d8;
                                                    QVar47.m_size = (qsizetype)local_1d0;
                                                    QVar99.m_data = L"0,2";
                                                    QVar99.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar47,QVar99,
                                                                                                                                                        
                                                  "testModel.index(0, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8ee);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x0);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar48.m_data = local_1d8;
                                                    QVar48.m_size = (qsizetype)local_1d0;
                                                    QVar100.m_data = L"0,0";
                                                    QVar100.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar48,QVar100,
                                                                                                                                                        
                                                  "testModel.index(0, 1, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8ef);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x0);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar49.m_data = local_1d8;
                                                    QVar49.m_size = (qsizetype)local_1d0;
                                                    QVar101.m_data = L"0,1";
                                                    QVar101.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar49,QVar101,
                                                                                                                                                        
                                                  "testModel.index(0, 2, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8f0);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x0);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar50.m_data = local_1d8;
                                                    QVar50.m_size = (qsizetype)local_1d0;
                                                    QVar102.m_data = L"0,3";
                                                    QVar102.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar50,QVar102,
                                                                                                                                                        
                                                  "testModel.index(0, 3, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8f1);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x0);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar51.m_data = local_1d8;
                                                    QVar51.m_size = (qsizetype)local_1d0;
                                                    QVar103.m_data = L"0,4";
                                                    QVar103.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar51,QVar103,
                                                                                                                                                        
                                                  "testModel.index(0, 4, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8f2);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x0);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar52.m_data = local_1d8;
                                                    QVar52.m_size = (qsizetype)local_1d0;
                                                    QVar104.m_data = L"0,5";
                                                    QVar104.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar52,QVar104,
                                                                                                                                                        
                                                  "testModel.index(0, 5, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"0,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8f3);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x1);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar53.m_data = local_1d8;
                                                    QVar53.m_size = (qsizetype)local_1d0;
                                                    QVar105.m_data = L"1,2";
                                                    QVar105.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar53,QVar105,
                                                                                                                                                        
                                                  "testModel.index(1, 0, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,2\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8f4);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x1);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar54.m_data = local_1d8;
                                                    QVar54.m_size = (qsizetype)local_1d0;
                                                    QVar106.m_data = L"1,0";
                                                    QVar106.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar54,QVar106,
                                                                                                                                                        
                                                  "testModel.index(1, 1, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,0\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8f5);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x1);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar55.m_data = local_1d8;
                                                    QVar55.m_size = (qsizetype)local_1d0;
                                                    QVar107.m_data = L"1,1";
                                                    QVar107.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar55,QVar107,
                                                                                                                                                        
                                                  "testModel.index(1, 2, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8f6);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x1);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar56.m_data = local_1d8;
                                                    QVar56.m_size = (qsizetype)local_1d0;
                                                    QVar108.m_data = L"1,3";
                                                    QVar108.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar56,QVar108,
                                                                                                                                                        
                                                  "testModel.index(1, 3, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,3\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8f7);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x1);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar57.m_data = local_1d8;
                                                    QVar57.m_size = (qsizetype)local_1d0;
                                                    QVar109.m_data = L"1,4";
                                                    QVar109.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar57,QVar109,
                                                                                                                                                        
                                                  "testModel.index(1, 4, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,4\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8f8);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    GenericModel::index((int)local_1a8,
                                                                        (int)&testModel,
                                                                        (QModelIndex *)0x1);
                                                    if (local_198 == (long *)0x0) {
                                                      args.d.d = (Data *)0x0;
                                                      args.d.ptr = (QVariant *)0x0;
                                                      args.d.size = 0;
                                                    }
                                                    else {
                                                      (**(code **)(*local_198 + 0x90))
                                                                (&args,local_198,local_1a8,0);
                                                    }
                                                    QVariant::toString();
                                                    QVar58.m_data = local_1d8;
                                                    QVar58.m_size = (qsizetype)local_1d0;
                                                    QVar110.m_data = L"1,5";
                                                    QVar110.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar58,QVar110,
                                                                                                                                                        
                                                  "testModel.index(1, 5, parIndex).data().toString()"
                                                  ,"QStringLiteral(\"1,5\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8f9);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    QPersistentModelIndex::data((int)&args);
                                                    QVariant::toString();
                                                    QVar59.m_data = local_1d8;
                                                    QVar59.m_size = (qsizetype)local_1d0;
                                                    QVar111.m_data = L"1,1";
                                                    QVar111.m_size = 3;
                                                    cVar2 = QTest::qCompare(QVar59,QVar111,
                                                                                                                                                        
                                                  "oneOneIndex.data().toString()",
                                                  "QStringLiteral(\"1,1\")",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8fa);
                                                  if (local_1e0 != (QArrayData *)0x0) {
                                                    LOCK();
                                                    (local_1e0->ref_)._q_value.
                                                    super___atomic_base<int>._M_i =
                                                         (local_1e0->ref_)._q_value.
                                                         super___atomic_base<int>._M_i + -1;
                                                    UNLOCK();
                                                    if ((local_1e0->ref_)._q_value.
                                                        super___atomic_base<int>._M_i == 0) {
                                                      QArrayData::deallocate(local_1e0,2,8);
                                                    }
                                                  }
                                                  QVariant::~QVariant((QVariant *)&args);
                                                  if (cVar2 != '\0') {
                                                    iVar5 = QPersistentModelIndex::column();
                                                    cVar2 = QTest::qCompare(iVar5,2,
                                                  "oneOneIndex.column()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8fb);
                                                  if (cVar2 != '\0') {
                                                    lVar7 = 0;
                                                    do {
                                                      lVar1 = *(long *)((long)spyArr + lVar7);
                                                      cVar2 = QTest::qCompare(*(longlong *)
                                                                               (lVar1 + 0x20),1,
                                                                              "spy->count()","1",
                                                                                                                                                            
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8fd);
                                                  if (cVar2 == '\0') break;
                                                  QList<QList<QVariant>_>::takeFirst
                                                            (&args,(QList<QList<QVariant>_> *)
                                                                   (lVar1 + 0x10));
                                                  QVariant::value<QModelIndex>
                                                            ((QModelIndex *)&local_1e0,args.d.ptr);
                                                  bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    ((QModelIndex *)&local_1e0,
                                                                     &parIndex,
                                                                                                                                          
                                                  "args.at(0).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x8ff);
                                                  if (!bVar4) {
LAB_00133af2:
                                                    QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                              (&args.d);
                                                    break;
                                                  }
                                                  iVar5 = QVariant::toInt((bool *)(args.d.ptr + 1));
                                                  cVar2 = QTest::qCompare(iVar5,0,
                                                  "args.at(1).toInt()","0",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x900);
                                                  if (cVar2 == '\0') goto LAB_00133af2;
                                                  iVar5 = QVariant::toInt((bool *)(args.d.ptr + 2));
                                                  cVar2 = QTest::qCompare(iVar5,1,
                                                  "args.at(2).toInt()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x901);
                                                  if (cVar2 == '\0') goto LAB_00133af2;
                                                  QVariant::value<QModelIndex>
                                                            ((QModelIndex *)&local_1e0,
                                                             args.d.ptr + 3);
                                                  bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                                                                    ((QModelIndex *)&local_1e0,
                                                                     &parIndex,
                                                                                                                                          
                                                  "args.at(3).value<QModelIndex>()","parIndex",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x902);
                                                  if (!bVar4) goto LAB_00133af2;
                                                  iVar5 = QVariant::toInt((bool *)(args.d.ptr + 4));
                                                  bVar3 = QTest::qCompare(iVar5,3,
                                                  "args.at(4).toInt()","3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                                  ,0x903);
                                                  QArrayDataPointer<QVariant>::~QArrayDataPointer
                                                            (&args.d);
                                                  bVar4 = lVar7 != 8;
                                                  lVar7 = lVar7 + 8;
                                                  } while ((bVar3 & bVar4) != 0);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  QPersistentModelIndex::~QPersistentModelIndex
                                                            (&oneOneIndex);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
                goto LAB_0013142e;
              }
            }
          }
        }
      }
    }
  }
  goto LAB_0013143b;
LAB_00131424:
  QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
LAB_0013142e:
  QPersistentModelIndex::~QPersistentModelIndex(&oneTwoIndex);
LAB_0013143b:
  columnsMovedSpy._0_8_ = &PTR_metaObject_00165910;
  QObject::~QObject((QObject *)&columnsMovedSpy.m_loop);
  if (columnsMovedSpy.args.d.d != (Data *)0x0) {
    LOCK();
    ((columnsMovedSpy.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((columnsMovedSpy.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((columnsMovedSpy.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(columnsMovedSpy.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (columnsMovedSpy.sig.d.d != (Data *)0x0) {
    LOCK();
    ((columnsMovedSpy.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((columnsMovedSpy.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((columnsMovedSpy.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
        0) {
      QArrayData::deallocate(&(columnsMovedSpy.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            (&columnsMovedSpy.super_QList<QList<QVariant>_>.d);
  QObject::~QObject(&columnsMovedSpy.super_QObject);
LAB_001314c2:
  rowsAboutToBeMovedSpy._0_8_ = &PTR_metaObject_00165910;
  QObject::~QObject((QObject *)&rowsAboutToBeMovedSpy.m_loop);
  if (rowsAboutToBeMovedSpy.args.d.d != (Data *)0x0) {
    LOCK();
    ((rowsAboutToBeMovedSpy.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((rowsAboutToBeMovedSpy.args.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((rowsAboutToBeMovedSpy.args.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(rowsAboutToBeMovedSpy.args.d.d)->super_QArrayData,4,8);
    }
  }
  if (rowsAboutToBeMovedSpy.sig.d.d != (Data *)0x0) {
    LOCK();
    ((rowsAboutToBeMovedSpy.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         = ((rowsAboutToBeMovedSpy.sig.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((rowsAboutToBeMovedSpy.sig.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate(&(rowsAboutToBeMovedSpy.sig.d.d)->super_QArrayData,1,8);
    }
  }
  QArrayDataPointer<QList<QVariant>_>::~QArrayDataPointer
            (&rowsAboutToBeMovedSpy.super_QList<QList<QVariant>_>.d);
  QObject::~QObject(&rowsAboutToBeMovedSpy.super_QObject);
  QObject::~QObject((QObject *)&probe);
  GenericModel::~GenericModel(&testModel);
  return;
}

Assistant:

void tst_GenericModel::moveColumnsTreeSameBranch()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    fillTable(&testModel, 2, 6);
    const QModelIndex parIndex = testModel.index(1, 0);
    fillTable(&testModel, 2, 6, parIndex);
    QSignalSpy rowsAboutToBeMovedSpy(&testModel, SIGNAL(columnsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsAboutToBeMovedSpy.isValid());
    QSignalSpy columnsMovedSpy(&testModel, SIGNAL(columnsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(columnsMovedSpy.isValid());
    QSignalSpy *spyArr[] = {&rowsAboutToBeMovedSpy, &columnsMovedSpy};

    QVERIFY(!testModel.moveColumns(parIndex, 2, 1, parIndex, -1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(parIndex, 2, 1, parIndex, 7));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(parIndex, -1, 1, parIndex, 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(parIndex, 6, 1, parIndex, 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(parIndex, 1, 2, parIndex, 2));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveColumns(parIndex, 1, 2, parIndex, 3));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);

    QPersistentModelIndex oneTwoIndex = testModel.index(1, 2, parIndex);
    QVERIFY(testModel.moveColumns(parIndex, 2, 1, parIndex, 4));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(0, 1, parIndex).data().toString(), QStringLiteral("0,1"));
    QCOMPARE(testModel.index(0, 2, parIndex).data().toString(), QStringLiteral("0,3"));
    QCOMPARE(testModel.index(0, 3, parIndex).data().toString(), QStringLiteral("0,2"));
    QCOMPARE(testModel.index(0, 4, parIndex).data().toString(), QStringLiteral("0,4"));
    QCOMPARE(testModel.index(0, 5, parIndex).data().toString(), QStringLiteral("0,5"));
    QCOMPARE(testModel.index(1, 0, parIndex).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(1, 1, parIndex).data().toString(), QStringLiteral("1,1"));
    QCOMPARE(testModel.index(1, 2, parIndex).data().toString(), QStringLiteral("1,3"));
    QCOMPARE(testModel.index(1, 3, parIndex).data().toString(), QStringLiteral("1,2"));
    QCOMPARE(testModel.index(1, 4, parIndex).data().toString(), QStringLiteral("1,4"));
    QCOMPARE(testModel.index(1, 5, parIndex).data().toString(), QStringLiteral("1,5"));
    QCOMPARE(oneTwoIndex.data().toString(), QStringLiteral("1,2"));
    QCOMPARE(oneTwoIndex.column(), 3);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 4);
    }

    fillTable(&testModel, 2, 6, parIndex);
    oneTwoIndex = testModel.index(1, 2, parIndex);
    QVERIFY(testModel.moveColumns(parIndex, 2, 1, parIndex, 0));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toString(), QStringLiteral("0,2"));
    QCOMPARE(testModel.index(0, 1, parIndex).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(0, 2, parIndex).data().toString(), QStringLiteral("0,1"));
    QCOMPARE(testModel.index(0, 3, parIndex).data().toString(), QStringLiteral("0,3"));
    QCOMPARE(testModel.index(0, 4, parIndex).data().toString(), QStringLiteral("0,4"));
    QCOMPARE(testModel.index(0, 5, parIndex).data().toString(), QStringLiteral("0,5"));
    QCOMPARE(testModel.index(1, 0, parIndex).data().toString(), QStringLiteral("1,2"));
    QCOMPARE(testModel.index(1, 1, parIndex).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(1, 2, parIndex).data().toString(), QStringLiteral("1,1"));
    QCOMPARE(testModel.index(1, 3, parIndex).data().toString(), QStringLiteral("1,3"));
    QCOMPARE(testModel.index(1, 4, parIndex).data().toString(), QStringLiteral("1,4"));
    QCOMPARE(testModel.index(1, 5, parIndex).data().toString(), QStringLiteral("1,5"));
    QCOMPARE(oneTwoIndex.data().toString(), QStringLiteral("1,2"));
    QCOMPARE(oneTwoIndex.column(), 0);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 0);
    }

    fillTable(&testModel, 2, 6, parIndex);
    oneTwoIndex = testModel.index(1, 2, parIndex);
    QVERIFY(testModel.moveColumns(parIndex, 2, 1, parIndex, 6));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(0, 1, parIndex).data().toString(), QStringLiteral("0,1"));
    QCOMPARE(testModel.index(0, 2, parIndex).data().toString(), QStringLiteral("0,3"));
    QCOMPARE(testModel.index(0, 3, parIndex).data().toString(), QStringLiteral("0,4"));
    QCOMPARE(testModel.index(0, 4, parIndex).data().toString(), QStringLiteral("0,5"));
    QCOMPARE(testModel.index(0, 5, parIndex).data().toString(), QStringLiteral("0,2"));
    QCOMPARE(testModel.index(1, 0, parIndex).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(1, 1, parIndex).data().toString(), QStringLiteral("1,1"));
    QCOMPARE(testModel.index(1, 2, parIndex).data().toString(), QStringLiteral("1,3"));
    QCOMPARE(testModel.index(1, 3, parIndex).data().toString(), QStringLiteral("1,4"));
    QCOMPARE(testModel.index(1, 4, parIndex).data().toString(), QStringLiteral("1,5"));
    QCOMPARE(testModel.index(1, 5, parIndex).data().toString(), QStringLiteral("1,2"));
    QCOMPARE(oneTwoIndex.data().toString(), QStringLiteral("1,2"));
    QCOMPARE(oneTwoIndex.column(), 5);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 2);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 6);
    }

    fillTable(&testModel, 2, 6, parIndex);
    QPersistentModelIndex oneOneIndex = testModel.index(1, 1, parIndex);
    QVERIFY(testModel.moveColumns(parIndex, 0, 2, parIndex, 3));
    QCOMPARE(testModel.index(0, 0, parIndex).data().toString(), QStringLiteral("0,2"));
    QCOMPARE(testModel.index(0, 1, parIndex).data().toString(), QStringLiteral("0,0"));
    QCOMPARE(testModel.index(0, 2, parIndex).data().toString(), QStringLiteral("0,1"));
    QCOMPARE(testModel.index(0, 3, parIndex).data().toString(), QStringLiteral("0,3"));
    QCOMPARE(testModel.index(0, 4, parIndex).data().toString(), QStringLiteral("0,4"));
    QCOMPARE(testModel.index(0, 5, parIndex).data().toString(), QStringLiteral("0,5"));
    QCOMPARE(testModel.index(1, 0, parIndex).data().toString(), QStringLiteral("1,2"));
    QCOMPARE(testModel.index(1, 1, parIndex).data().toString(), QStringLiteral("1,0"));
    QCOMPARE(testModel.index(1, 2, parIndex).data().toString(), QStringLiteral("1,1"));
    QCOMPARE(testModel.index(1, 3, parIndex).data().toString(), QStringLiteral("1,3"));
    QCOMPARE(testModel.index(1, 4, parIndex).data().toString(), QStringLiteral("1,4"));
    QCOMPARE(testModel.index(1, 5, parIndex).data().toString(), QStringLiteral("1,5"));
    QCOMPARE(oneOneIndex.data().toString(), QStringLiteral("1,1"));
    QCOMPARE(oneOneIndex.column(), 2);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 0);
        QCOMPARE(args.at(2).toInt(), 1);
        QCOMPARE(args.at(3).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(4).toInt(), 3);
    }
}